

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

void __thiscall
ghc::filesystem::permissions(filesystem *this,path *p,perms prms,perm_options opts,error_code *ec)

{
  uintmax_t *sz;
  uint uVar1;
  int iVar2;
  int *piVar3;
  uintmax_t uVar4;
  undefined6 in_register_0000000a;
  file_status fs;
  ushort local_2c;
  
  sz = (uintmax_t *)CONCAT62(in_register_0000000a,opts);
  if ((prms & (others_write|others_exec)) == none) {
    uVar4 = std::_V2::system_category();
    *(undefined4 *)sz = 0x16;
  }
  else {
    uVar1 = (uint)p;
    detail::symlink_status_ex
              ((path *)&stack0xffffffffffffffd0,(error_code *)this,sz,
               (uintmax_t *)CONCAT62(in_register_0000000a,opts),(time_t *)ec);
    if ((prms & (others_write|others_exec)) != (others_write|others_exec)) {
      if ((prms & others_exec) == none) {
        uVar1 = (uint)local_2c & ~uVar1;
      }
      else {
        uVar1 = local_2c | uVar1;
      }
    }
    if ((prms & others_read) != none) {
      return;
    }
    iVar2 = chmod(*(char **)this,uVar1 & 0xffff);
    if (iVar2 == 0) {
      return;
    }
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    uVar4 = std::_V2::system_category();
    *(int *)sz = iVar2;
  }
  sz[1] = uVar4;
  return;
}

Assistant:

GHC_INLINE void permissions(const path& p, perms prms, perm_options opts, std::error_code& ec)
{
    if (static_cast<int>(opts & (perm_options::replace | perm_options::add | perm_options::remove)) == 0) {
        ec = detail::make_error_code(detail::portable_error::invalid_argument);
        return;
    }
    auto fs = symlink_status(p, ec);
    if ((opts & perm_options::replace) != perm_options::replace) {
        if ((opts & perm_options::add) == perm_options::add) {
            prms = fs.permissions() | prms;
        }
        else {
            prms = fs.permissions() & ~prms;
        }
    }
#ifdef GHC_OS_WINDOWS
#ifdef __GNUC__
    auto oldAttr = GetFileAttributesW(p.wstring().c_str());
    if (oldAttr != INVALID_FILE_ATTRIBUTES) {
        DWORD newAttr = ((prms & perms::owner_write) == perms::owner_write) ? oldAttr & ~(static_cast<DWORD>(FILE_ATTRIBUTE_READONLY)) : oldAttr | FILE_ATTRIBUTE_READONLY;
        if (oldAttr == newAttr || SetFileAttributesW(p.wstring().c_str(), newAttr)) {
            return;
        }
    }
    ec = detail::make_system_error();
#else
    int mode = 0;
    if ((prms & perms::owner_read) == perms::owner_read) {
        mode |= _S_IREAD;
    }
    if ((prms & perms::owner_write) == perms::owner_write) {
        mode |= _S_IWRITE;
    }
    if (::_wchmod(p.wstring().c_str(), mode) != 0) {
        ec = detail::make_system_error();
    }
#endif
#else
    if ((opts & perm_options::nofollow) != perm_options::nofollow) {
        if (::chmod(p.c_str(), static_cast<mode_t>(prms)) != 0) {
            ec = detail::make_system_error();
        }
    }
#endif
}